

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::CallNativeHostPromiseRejectionTracker
          (JavascriptLibrary *this,Var promise,Var reason,bool handled)

{
  ThreadContext *pTVar1;
  ScriptContext *pSVar2;
  undefined1 local_60 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  if ((this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTracker != (Type)0x0) {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_60,
               (this->super_JavascriptLibraryBase).scriptContext.ptr,&stack0xfffffffffffffff8);
    pTVar1 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
    __leaveScriptObject._39_1_ = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    (*(this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTracker)
              (promise,reason,handled,
               (this->super_JavascriptLibraryBase).nativeHostPromiseRejectionTrackerState.ptr);
    pSVar2 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
    if (pSVar2 != (ScriptContext *)0x0) {
      ThreadContext::DisposeOnLeaveScript(pSVar2->threadContext);
    }
    pTVar1->reentrancySafeOrHandled = (bool)__leaveScriptObject._39_1_;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_60);
  }
  return;
}

Assistant:

void JavascriptLibrary::CallNativeHostPromiseRejectionTracker(Var promise, Var reason, bool handled)
    {
        if (this->nativeHostPromiseRejectionTracker != nullptr)
        {
            BEGIN_LEAVE_SCRIPT(scriptContext);
            try
            {
                this->nativeHostPromiseRejectionTracker(promise, reason, handled, this->nativeHostPromiseRejectionTrackerState);
            }
            catch (...)
            {
                // Hosts are required not to pass exceptions back across the callback boundary. If
                // this happens, it is a bug in the host, not something that we are expected to
                // handle gracefully.
                Js::Throw::FatalInternalError();
            }
            END_LEAVE_SCRIPT(scriptContext);
        }
    }